

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_listener_base.cpp
# Opt level: O3

void __thiscall zmq::stream_listener_base_t::~stream_listener_base_t(stream_listener_base_t *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_own_t).super_object_t._vptr_object_t =
       (_func_int **)&PTR__stream_listener_base_t_001e9378;
  (this->super_io_object_t).super_i_poll_events._vptr_i_poll_events =
       (_func_int **)&PTR__stream_listener_base_t_001e9460;
  if (this->_s != -1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_s == retired_fd",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_listener_base.cpp"
            ,0x39);
    fflush(_stderr);
    zmq_abort("_s == retired_fd");
  }
  if (this->_handle != (handle_t)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!_handle",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_listener_base.cpp"
            ,0x3a);
    fflush(_stderr);
    zmq_abort("!_handle");
  }
  pcVar2 = (this->_endpoint)._M_dataplus._M_p;
  paVar1 = &(this->_endpoint).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  io_object_t::~io_object_t(&this->super_io_object_t);
  own_t::~own_t(&this->super_own_t);
  return;
}

Assistant:

zmq::stream_listener_base_t::~stream_listener_base_t ()
{
    zmq_assert (_s == retired_fd);
    zmq_assert (!_handle);
}